

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * __thiscall kwssys::RegExpCompile::regpiece(RegExpCompile *this,int *flagp)

{
  byte bVar1;
  char op;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  int flags;
  
  pcVar2 = regatom(this,&flags);
  if (pcVar2 == (char *)0x0) {
    return (char *)0x0;
  }
  bVar1 = *this->regparse;
  if ((0x3f < (ulong)bVar1) || ((0x80000c0000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
    *flagp = flags;
    return pcVar2;
  }
  if (bVar1 != 0x3f && (flags & 1U) == 0) {
    pcVar2 = "RegularExpression::compile() : *+ operand could be empty.";
    goto LAB_0014ce95;
  }
  *flagp = (uint)(bVar1 != 0x2b) * 3 + 1;
  if (bVar1 == 0x2a) {
    if ((flags & 2U) == 0) {
      reginsert(this,'\x06',pcVar2);
      pcVar3 = regnode(this,'\a');
      regoptail(pcVar2,pcVar3);
      regoptail(pcVar2,pcVar2);
      pcVar4 = regnode(this,'\x06');
      pcVar3 = pcVar2;
LAB_0014cdf3:
      regtail(pcVar3,pcVar4);
      pcVar3 = regnode(this,'\t');
      regtail(pcVar2,pcVar3);
    }
    else {
      op = '\n';
LAB_0014ce68:
      reginsert(this,op,pcVar2);
    }
  }
  else {
    if (bVar1 == 0x2b) {
      if ((flags & 2U) != 0) {
        op = '\v';
        goto LAB_0014ce68;
      }
      pcVar3 = regnode(this,'\x06');
      regtail(pcVar2,pcVar3);
      pcVar4 = regnode(this,'\a');
      regtail(pcVar4,pcVar2);
      pcVar4 = regnode(this,'\x06');
      goto LAB_0014cdf3;
    }
    if (bVar1 == 0x3f) {
      reginsert(this,'\x06',pcVar2);
      pcVar3 = regnode(this,'\x06');
      regtail(pcVar2,pcVar3);
      pcVar3 = regnode(this,'\t');
      regtail(pcVar2,pcVar3);
      regoptail(pcVar2,pcVar3);
    }
  }
  pcVar3 = this->regparse;
  this->regparse = pcVar3 + 1;
  uVar5 = (ulong)(byte)pcVar3[1];
  if (0x3f < uVar5) {
    return pcVar2;
  }
  if ((0x80000c0000000000U >> (uVar5 & 0x3f) & 1) == 0) {
    return pcVar2;
  }
  pcVar2 = "RegularExpression::compile(): Nested *?+.";
LAB_0014ce95:
  puts(pcVar2);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::regpiece(int* flagp)
{
  char* ret;
  char op;
  char* next;
  int flags;

  ret = regatom(&flags);
  if (ret == nullptr)
    return (nullptr);

  op = *regparse;
  if (!ISMULT(op)) {
    *flagp = flags;
    return (ret);
  }

  if (!(flags & HASWIDTH) && op != '?') {
    // RAISE Error, SYM(RegularExpression), SYM(Empty_Operand),
    printf("RegularExpression::compile() : *+ operand could be empty.\n");
    return nullptr;
  }
  *flagp = (op != '+') ? (WORST | SPSTART) : (WORST | HASWIDTH);

  if (op == '*' && (flags & SIMPLE))
    reginsert(STAR, ret);
  else if (op == '*') {
    // Emit x* as (x&|), where & means "self".
    reginsert(BRANCH, ret);         // Either x
    regoptail(ret, regnode(BACK));  // and loop
    regoptail(ret, ret);            // back
    regtail(ret, regnode(BRANCH));  // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '+' && (flags & SIMPLE))
    reginsert(PLUS, ret);
  else if (op == '+') {
    // Emit x+ as x(&|), where & means "self".
    next = regnode(BRANCH); // Either
    regtail(ret, next);
    regtail(regnode(BACK), ret);    // loop back
    regtail(next, regnode(BRANCH)); // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '?') {
    // Emit x? as (x|)
    reginsert(BRANCH, ret);        // Either x
    regtail(ret, regnode(BRANCH)); // or
    next = regnode(NOTHING);       // null.
    regtail(ret, next);
    regoptail(ret, next);
  }
  regparse++;
  if (ISMULT(*regparse)) {
    // RAISE Error, SYM(RegularExpression), SYM(Nested_Operand),
    printf("RegularExpression::compile(): Nested *?+.\n");
    return nullptr;
  }
  return (ret);
}